

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPreData.cpp
# Opt level: O2

void __thiscall HPreData::HPreData(HPreData *this)

{
  memset(&this->Astart,0,0xc0);
  memset(&this->colValue,0,0x1f8);
  std::stack<double,std::deque<double,std::allocator<double>>>::
  stack<std::deque<double,std::allocator<double>>,void>(&this->postValue);
  (this->cIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->cIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->rIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->cIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->rIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  KktChStep::KktChStep(&this->chk);
  std::stack<change,std::deque<change,std::allocator<change>>>::
  stack<std::deque<change,std::allocator<change>>,void>(&this->chng);
  std::
  stack<std::pair<int,std::vector<double,std::allocator<double>>>,std::deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>>
  ::
  stack<std::deque<std::pair<int,std::vector<double,std::allocator<double>>>,std::allocator<std::pair<int,std::vector<double,std::allocator<double>>>>>,void>
            (&this->oldBounds);
  return;
}

Assistant:

HPreData::HPreData() {

}